

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * ImFileLoadToMemory(char *filename,char *file_open_mode,size_t *out_file_size,
                         int padding_bytes)

{
  int iVar1;
  FILE *__stream;
  size_t __n;
  size_t sVar2;
  void *file_data;
  size_t file_size;
  long file_size_signed;
  FILE *f;
  int padding_bytes_local;
  size_t *out_file_size_local;
  char *file_open_mode_local;
  char *filename_local;
  
  if (filename == (char *)0x0 || file_open_mode == (char *)0x0) {
    __assert_fail("filename && file_open_mode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x63c,"void *ImFileLoadToMemory(const char *, const char *, size_t *, int)");
  }
  if (out_file_size != (size_t *)0x0) {
    *out_file_size = 0;
  }
  __stream = (FILE *)ImFileOpen(filename,file_open_mode);
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (((iVar1 == 0) && (__n = ftell(__stream), __n != 0xffffffffffffffff)) &&
       (iVar1 = fseek(__stream,0,0), iVar1 == 0)) {
      filename_local = (char *)ImGui::MemAlloc(__n + (long)padding_bytes);
      if (filename_local == (char *)0x0) {
        fclose(__stream);
        filename_local = (char *)0x0;
      }
      else {
        sVar2 = fread(filename_local,1,__n,__stream);
        if (sVar2 == __n) {
          if (0 < padding_bytes) {
            memset(filename_local + __n,0,(long)padding_bytes);
          }
          fclose(__stream);
          if (out_file_size != (size_t *)0x0) {
            *out_file_size = __n;
          }
        }
        else {
          fclose(__stream);
          ImGui::MemFree(filename_local);
          filename_local = (char *)0x0;
        }
      }
    }
    else {
      fclose(__stream);
      filename_local = (char *)0x0;
    }
  }
  return filename_local;
}

Assistant:

void* ImFileLoadToMemory(const char* filename, const char* file_open_mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && file_open_mode);
    if (out_file_size)
        *out_file_size = 0;

    FILE* f;
    if ((f = ImFileOpen(filename, file_open_mode)) == NULL)
        return NULL;

    long file_size_signed;
    if (fseek(f, 0, SEEK_END) || (file_size_signed = ftell(f)) == -1 || fseek(f, 0, SEEK_SET))
    {
        fclose(f);
        return NULL;
    }

    size_t file_size = (size_t)file_size_signed;
    void* file_data = IM_ALLOC(file_size + padding_bytes);
    if (file_data == NULL)
    {
        fclose(f);
        return NULL;
    }
    if (fread(file_data, 1, file_size, f) != file_size)
    {
        fclose(f);
        IM_FREE(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    fclose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}